

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void * __thiscall google::protobuf::DescriptorPool::Tables::AllocateBytes(Tables *this,int size)

{
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  *this_00;
  int in_ESI;
  char **in_RDI;
  ulong uVar1;
  vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
  *this_01;
  pointer local_8;
  
  if (in_ESI == 0) {
    local_8 = (pointer)0x0;
  }
  else {
    this_01 = (vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
               *)(in_RDI + 0x18);
    uVar1 = (ulong)in_ESI;
    if ((long)uVar1 < 0) {
      uVar1 = 0xffffffffffffffff;
    }
    this_00 = (vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
               *)operator_new__(uVar1);
    std::
    vector<std::unique_ptr<char[],std::default_delete<char[]>>,std::allocator<std::unique_ptr<char[],std::default_delete<char[]>>>>
    ::emplace_back<char*>(this_00,in_RDI);
    std::
    vector<std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::allocator<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
    ::back(this_01);
    local_8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                        ((unique_ptr<char[],_std::default_delete<char[]>_> *)this_01);
  }
  return local_8;
}

Assistant:

void* DescriptorPool::Tables::AllocateBytes(int size) {
  // TODO(kenton):  Would it be worthwhile to implement this in some more
  // sophisticated way?  Probably not for the open source release, but for
  // internal use we could easily plug in one of our existing memory pool
  // allocators...
  if (size == 0) return nullptr;

  allocations_.emplace_back(new char[size]);
  return allocations_.back().get();
}